

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int compression_init_encoder_lzma
              (archive *a,la_zstream_conflict *lastrm,int level,uint64_t filter_id)

{
  char cVar1;
  int iVar2;
  void *__dest;
  uint8_t *puVar3;
  int local_b4;
  undefined1 local_b0 [4];
  int r;
  lzma_options_lzma lzma_opt;
  lzma_filter *lzmafilters;
  lzma_stream *strm;
  uint64_t filter_id_local;
  int level_local;
  la_zstream_conflict *lastrm_local;
  archive *a_local;
  
  if (lastrm->valid != 0) {
    compression_end(a,lastrm);
  }
  __dest = calloc(1,0xa8);
  if (__dest == (void *)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate memory for lzma stream");
    a_local._4_4_ = -0x1e;
  }
  else {
    lzma_opt.reserved_ptr2 = (void *)((long)__dest + 0x88);
    filter_id_local._4_4_ = level;
    if (9 < level) {
      filter_id_local._4_4_ = 9;
    }
    cVar1 = lzma_lzma_preset(local_b0,filter_id_local._4_4_);
    if (cVar1 == '\0') {
      *(uint64_t *)lzma_opt.reserved_ptr2 = filter_id;
      *(undefined1 **)((long)lzma_opt.reserved_ptr2 + 8) = local_b0;
      *(undefined8 *)((long)lzma_opt.reserved_ptr2 + 0x10) = 0xffffffffffffffff;
      iVar2 = lzma_properties_size(&lastrm->prop_size,lzma_opt.reserved_ptr2);
      if (iVar2 == 0) {
        if (lastrm->prop_size != 0) {
          puVar3 = (uint8_t *)malloc((ulong)lastrm->prop_size);
          lastrm->props = puVar3;
          if (lastrm->props == (uint8_t *)0x0) {
            free(__dest);
            lastrm->real_stream = (void *)0x0;
            archive_set_error(a,0xc,"Cannot allocate memory");
            return -0x1e;
          }
          iVar2 = lzma_properties_encode(lzma_opt.reserved_ptr2,lastrm->props);
          if (iVar2 != 0) {
            free(__dest);
            lastrm->real_stream = (void *)0x0;
            archive_set_error(a,-1,"lzma_properties_encode failed");
            return -0x1e;
          }
        }
        memcpy(__dest,&compression_init_encoder_lzma::lzma_init_data,0x88);
        iVar2 = lzma_raw_encoder(__dest,lzma_opt.reserved_ptr2);
        if (iVar2 == 0) {
          lastrm->real_stream = __dest;
          lastrm->valid = 1;
          lastrm->code = compression_code_lzma;
          lastrm->end = compression_end_lzma;
          local_b4 = 0;
        }
        else if (iVar2 == 5) {
          free(__dest);
          lastrm->real_stream = (void *)0x0;
          archive_set_error(a,0xc,
                            "Internal error initializing compression library: Cannot allocate memory"
                           );
          local_b4 = -0x1e;
        }
        else {
          free(__dest);
          lastrm->real_stream = (void *)0x0;
          archive_set_error(a,-1,
                            "Internal error initializing compression library: It\'s a bug in liblzma"
                           );
          local_b4 = -0x1e;
        }
        a_local._4_4_ = local_b4;
      }
      else {
        free(__dest);
        lastrm->real_stream = (void *)0x0;
        archive_set_error(a,-1,"lzma_properties_size failed");
        a_local._4_4_ = -0x1e;
      }
    }
    else {
      free(__dest);
      lastrm->real_stream = (void *)0x0;
      archive_set_error(a,0xc,"Internal error initializing compression library");
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_init_encoder_lzma(struct archive *a,
    struct la_zstream *lastrm, int level)
{
	static const lzma_stream lzma_init_data = LZMA_STREAM_INIT;
	lzma_stream *strm;
	lzma_options_lzma lzma_opt;
	int r;

	if (lastrm->valid)
		compression_end(a, lastrm);
	if (lzma_lzma_preset(&lzma_opt, level)) {
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	strm = calloc(1, sizeof(*strm));
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for lzma stream");
		return (ARCHIVE_FATAL);
	}
	*strm = lzma_init_data;
	r = lzma_alone_encoder(strm, &lzma_opt);
	switch (r) {
	case LZMA_OK:
		lastrm->real_stream = strm;
		lastrm->valid = 1;
		lastrm->code = compression_code_lzma;
		lastrm->end = compression_end_lzma;
		r = ARCHIVE_OK;
		break;
	case LZMA_MEM_ERROR:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library: "
		    "Cannot allocate memory");
		r =  ARCHIVE_FATAL;
		break;
        default:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "It's a bug in liblzma");
		r =  ARCHIVE_FATAL;
		break;
	}
	return (r);
}